

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

_Bool menu_action_handle(menu *m,ui_event *event,int oid)

{
  _Bool _Var1;
  uint *puVar2;
  menu_action *acts;
  int oid_local;
  ui_event *event_local;
  menu *m_local;
  
  puVar2 = (uint *)menu_priv(m);
  if (event->type == EVT_SELECT) {
    if (((*puVar2 & 1) == 0) && (*(long *)(puVar2 + (long)oid * 6 + 4) != 0)) {
      (**(code **)(puVar2 + (long)oid * 6 + 4))
                (*(undefined8 *)(puVar2 + (long)oid * 6 + 2),m->cursor);
      return true;
    }
  }
  else if ((m->keys_hook != (_func__Bool_menu_ptr_ui_event_ptr_int *)0x0) &&
          (event->type == EVT_KBRD)) {
    _Var1 = (*m->keys_hook)(m,event,oid);
    return _Var1;
  }
  return false;
}

Assistant:

static bool menu_action_handle(struct menu *m, const ui_event *event, int oid)
{
	menu_action *acts = menu_priv(m);

	if (event->type == EVT_SELECT) {
		if (!(acts->flags & MN_ACT_GRAYED) && acts[oid].action) {
			acts[oid].action(acts[oid].name, m->cursor);
			return true;
		}
	} else if (m->keys_hook && event->type == EVT_KBRD) {
		return m->keys_hook(m, event, oid);
	}

	return false;
}